

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Generators::Generators<LargeNumbers>::populate
          (Generators<LargeNumbers> *this,LargeNumbers *val)

{
  pointer *__ptr;
  GeneratorWrapper<LargeNumbers> local_18;
  
  local_18.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<LargeNumbers>,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
  .super__Head_base<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_false>._M_head_impl =
       (unique_ptr<Catch::Generators::IGenerator<LargeNumbers>,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
        )operator_new(0x10);
  *(undefined ***)
   local_18.m_generator._M_t.
   super___uniq_ptr_impl<Catch::Generators::IGenerator<LargeNumbers>,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
   .super__Head_base<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_false>._M_head_impl =
       &PTR__GeneratorUntypedBase_001c2be0;
  *(LargeNumbers *)
   ((long)local_18.m_generator._M_t.
          super___uniq_ptr_impl<Catch::Generators::IGenerator<LargeNumbers>,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
          .super__Head_base<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_false>._M_head_impl
   + 8) = *val;
  std::
  vector<Catch::Generators::GeneratorWrapper<LargeNumbers>,std::allocator<Catch::Generators::GeneratorWrapper<LargeNumbers>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<LargeNumbers>>
            ((vector<Catch::Generators::GeneratorWrapper<LargeNumbers>,std::allocator<Catch::Generators::GeneratorWrapper<LargeNumbers>>>
              *)&this->m_generators,&local_18);
  if (local_18.m_generator._M_t.
      super___uniq_ptr_impl<Catch::Generators::IGenerator<LargeNumbers>,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
      .super__Head_base<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_false>._M_head_impl !=
      (__uniq_ptr_data<Catch::Generators::IGenerator<LargeNumbers>,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_18.m_generator._M_t.
                          super___uniq_ptr_impl<Catch::Generators::IGenerator<LargeNumbers>,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
                          .
                          super__Head_base<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_false>
                          ._M_head_impl + 8))();
  }
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }